

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec32.c
# Opt level: O0

void chacha20_core_32(uint32_t *k,uint32_t *ctx,uint32_t ctr)

{
  uint32_t x_15;
  uint32_t *os_15;
  uint32_t x_14;
  uint32_t *os_14;
  uint32_t x_13;
  uint32_t *os_13;
  uint32_t x_12;
  uint32_t *os_12;
  uint32_t x_11;
  uint32_t *os_11;
  uint32_t x_10;
  uint32_t *os_10;
  uint32_t x_9;
  uint32_t *os_9;
  uint32_t x_8;
  uint32_t *os_8;
  uint32_t x_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t *os_4;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t *os;
  uint32_t i;
  uint32_t cv;
  uint32_t ctr_u32;
  uint32_t ctr_local;
  uint32_t *ctx_local;
  uint32_t *k_local;
  
  memcpy(k,ctx,0x40);
  k[0xc] = k[0xc] + ctr;
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  *k = *k + *ctx;
  k[1] = k[1] + ctx[1];
  k[2] = k[2] + ctx[2];
  k[3] = k[3] + ctx[3];
  k[4] = k[4] + ctx[4];
  k[5] = k[5] + ctx[5];
  k[6] = k[6] + ctx[6];
  k[7] = k[7] + ctx[7];
  k[8] = k[8] + ctx[8];
  k[9] = k[9] + ctx[9];
  k[10] = k[10] + ctx[10];
  k[0xb] = k[0xb] + ctx[0xb];
  k[0xc] = k[0xc] + ctx[0xc];
  k[0xd] = k[0xd] + ctx[0xd];
  k[0xe] = k[0xe] + ctx[0xe];
  k[0xf] = k[0xf] + ctx[0xf];
  k[0xc] = k[0xc] + ctr;
  return;
}

Assistant:

static inline void chacha20_core_32(uint32_t *k, uint32_t *ctx, uint32_t ctr)
{
  memcpy(k, ctx, 16U * sizeof (uint32_t));
  uint32_t ctr_u32 = 1U * ctr;
  uint32_t cv = ctr_u32;
  k[12U] = k[12U] + cv;
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = k;
    uint32_t x = k[i] + ctx[i];
    os[i] = x;);
  k[12U] = k[12U] + cv;
}